

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall
higan::Logger::Logger(Logger *this,LogLevel level,char *full_file_name,int line,char *func_name)

{
  uint uVar1;
  int iVar2;
  int64_t time;
  char *pcVar3;
  size_t sVar4;
  char *local_78;
  char *file_name;
  TimeStamp stamp;
  string local_50 [4];
  pid_t pid;
  string thread_id_;
  char *func_name_local;
  int line_local;
  char *full_file_name_local;
  LogLevel level_local;
  Logger *this_local;
  
  thread_id_.field_2._8_8_ = func_name;
  TinyBuffer::TinyBuffer(&this->buffer_);
  this->level_ = level;
  std::__cxx11::string::string(local_50);
  uVar1 = System::GetTid();
  time = TimeStamp::Now();
  TimeStamp::TimeStamp((TimeStamp *)&file_name,time);
  pcVar3 = TinyBuffer::WriteBegin(&this->buffer_);
  sVar4 = TinyBuffer::WritableSize(&this->buffer_);
  sVar4 = TimeStamp::FormatToBuffer((TimeStamp *)&file_name,pcVar3,sVar4);
  TinyBuffer::AddWriteIndex(&this->buffer_,sVar4);
  pcVar3 = strrchr(full_file_name,0x2f);
  local_78 = full_file_name;
  if (pcVar3 != (char *)0x0) {
    local_78 = pcVar3 + 1;
  }
  pcVar3 = TinyBuffer::WriteBegin(&this->buffer_);
  sVar4 = TinyBuffer::WritableSize(&this->buffer_);
  iVar2 = snprintf(pcVar3,sVar4," [pid: %d] [%s] [%s:%d - %s] ",(ulong)uVar1,
                   G_LEVEL_TO_STRING[(int)level],local_78,line,thread_id_.field_2._8_8_);
  TinyBuffer::AddWriteIndex(&this->buffer_,(long)iVar2);
  TimeStamp::~TimeStamp((TimeStamp *)&file_name);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

Logger::Logger(LogLevel level, const char* full_file_name, int line, const char* func_name):
		level_(level)
{
	std::string thread_id_;

	pid_t pid = System::GetTid();

	TimeStamp stamp(TimeStamp::Now());
	buffer_.AddWriteIndex(stamp.FormatToBuffer(buffer_.WriteBegin(), buffer_.WritableSize()));

	const char* file_name = strrchr(full_file_name, '/');
	if (file_name)
	{
		file_name += 1;
	}
	else
	{
		file_name = full_file_name;
	}

	buffer_.AddWriteIndex(snprintf(buffer_.WriteBegin(), buffer_.WritableSize(),
			" [pid: %d] [%s] [%s:%d - %s] ",
			pid,
			G_LEVEL_TO_STRING[static_cast<int>(level)],
			file_name,
			line,
			func_name));
}